

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-rbtree.c
# Opt level: O1

void test_walk_backward(void)

{
  int iVar1;
  RBTREE_NODE *pRVar2;
  RBTREE_NODE *pRVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  VAL key;
  RBTREE tree;
  RBTREE_CURSOR cur;
  RBTREE_NODE local_450;
  RBTREE local_440;
  RBTREE_CURSOR local_438;
  
  local_440.root = (RBTREE_NODE *)0x0;
  lVar6 = 0x109d18;
  lVar4 = 0;
  do {
    acutest_case_("%s",test_walk_backward::vectors[lVar4].name);
    lVar5 = 0;
    do {
      pRVar2 = make_val(*(int *)(lVar6 + lVar5 * 4));
      iVar1 = rbtree_insert(&local_440,pRVar2,val_cmp);
      acutest_check_((uint)(iVar1 == 0),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                     ,0x143,"%s","rbtree_insert(&tree, make_val(values[i]), val_cmp) == 0");
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xf);
    iVar1 = rbtree_verify(&local_440);
    acutest_check_((uint)(iVar1 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x144,"%s","rbtree_verify(&tree) == 0");
    pRVar2 = rbtree_tail(&local_440,&local_438);
    if (pRVar2 != (RBTREE_NODE *)0x0) {
      iVar1 = 0xf;
      do {
        acutest_check_((uint)(iVar1 == *(int *)&pRVar2[-1].r),
                       "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                       ,0x14d,"%s","val->x == i");
        pRVar2 = rbtree_prev(&local_438);
        iVar1 = iVar1 + -1;
      } while (pRVar2 != (RBTREE_NODE *)0x0);
    }
    pRVar2 = rbtree_prev(&local_438);
    acutest_check_((uint)(pRVar2 == (RBTREE_NODE *)0x0),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x151,"%s","rbtree_prev(&cur) == NULL");
    pRVar2 = rbtree_current(&local_438);
    pRVar3 = rbtree_lookup(&local_440,&local_450,val_cmp);
    acutest_check_((uint)(pRVar2 == pRVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x155,"%s",
                   "rbtree_current(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp)");
    pRVar2 = rbtree_next(&local_438);
    pRVar3 = rbtree_lookup(&local_440,&local_450,val_cmp);
    acutest_check_((uint)(pRVar2 == pRVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-rbtree.c"
                   ,0x157,"%s","rbtree_next(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp)");
    clear_tree(&local_440);
    lVar4 = lVar4 + 1;
    lVar6 = lVar6 + 0x48;
  } while (lVar4 != 3);
  return;
}

Assistant:

static void
test_walk_backward(void)
{
    static const struct {
        const char* name;
        int values[15];
    } vectors[] = {
        { "Ascending order",    { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 } },
        { "Descending order",   { 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1 } },
        { "Randomized order",   { 8, 1, 12, 6, 4, 14, 11, 9, 10, 15, 2, 13, 3, 5, 7 } }
    };

    RBTREE tree = RBTREE_INITIALIZER;
    int vec, i;
    VAL* val;
    VAL key;

    for(vec = 0; vec < sizeof(vectors) / sizeof(vectors[0]); vec++) {
        const char* name = vectors[vec].name;
        const int* values = vectors[vec].values;
        RBTREE_CURSOR cur;
        RBTREE_NODE* node;

        TEST_CASE(name);

        for(i = 0; i < 15; i++)
            TEST_CHECK(rbtree_insert(&tree, make_val(values[i]), val_cmp) == 0);
        TEST_CHECK(rbtree_verify(&tree) == 0);

        /* Verify the cur visits all the nodes and that it happens in the
         * right order. */
        for(node = rbtree_tail(&tree, &cur), i = 15;
            node != NULL;
            node = rbtree_prev(&cur), i--)
        {
            val = RBTREE_DATA(node, VAL, the_node);
            TEST_CHECK(val->x == i);
        }

        /* Verify any other attempt to go forward still returns NULL. */
        TEST_CHECK(rbtree_prev(&cur) == NULL);

        /* Verify we still point to the first node and user can walk forward again. */
        key.x = 1;
        TEST_CHECK(rbtree_current(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp));
        key.x = 2;
        TEST_CHECK(rbtree_next(&cur) == rbtree_lookup(&tree, &key.the_node, val_cmp));

        clear_tree(&tree);
    }
}